

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load_raw<char>(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *this,enable_if_t<std::is_same<char,_char>::value,_handle> src)

{
  int iVar1;
  PyObject **ppPVar2;
  char *pcVar3;
  ulong uVar4;
  string *in_RDI;
  char *bytearray;
  char *bytes;
  PyTypeObject *in_stack_ffffffffffffff38;
  PyObject *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff50;
  allocator *paVar5;
  allocator local_81;
  string local_80 [32];
  char *local_60;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  handle local_10;
  bool local_1;
  
  ppPVar2 = pybind11::handle::ptr(&local_10);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x8000000);
  if (iVar1 == 0) {
    pybind11::handle::ptr(&local_10);
    iVar1 = _PyObject_TypeCheck(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (iVar1 == 0) {
      local_1 = false;
    }
    else {
      ppPVar2 = pybind11::handle::ptr(&local_10);
      pcVar3 = (char *)PyByteArray_AsString(*ppPVar2);
      local_60 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pybind11_fail(in_stack_ffffffffffffff50);
      }
      ppPVar2 = pybind11::handle::ptr(&local_10);
      uVar4 = PyByteArray_Size(*ppPVar2);
      paVar5 = &local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,pcVar3,uVar4,paVar5);
      std::__cxx11::string::operator=(in_RDI,local_80);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      local_1 = true;
    }
  }
  else {
    ppPVar2 = pybind11::handle::ptr(&local_10);
    pcVar3 = (char *)PyBytes_AsString(*ppPVar2);
    local_20 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pybind11_fail(in_stack_ffffffffffffff50);
    }
    ppPVar2 = pybind11::handle::ptr(&local_10);
    uVar4 = PyBytes_Size(*ppPVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar3,uVar4,&local_41);
    std::__cxx11::string::operator=(in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool load_raw(enable_if_t<std::is_same<C, char>::value, handle> src) {
        if (PYBIND11_BYTES_CHECK(src.ptr())) {
            // We were passed raw bytes; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytes = PYBIND11_BYTES_AS_STRING(src.ptr());
            if (!bytes) {
                pybind11_fail("Unexpected PYBIND11_BYTES_AS_STRING() failure.");
            }
            value = StringType(bytes, (size_t) PYBIND11_BYTES_SIZE(src.ptr()));
            return true;
        }
        if (PyByteArray_Check(src.ptr())) {
            // We were passed a bytearray; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytearray = PyByteArray_AsString(src.ptr());
            if (!bytearray) {
                pybind11_fail("Unexpected PyByteArray_AsString() failure.");
            }
            value = StringType(bytearray, (size_t) PyByteArray_Size(src.ptr()));
            return true;
        }

        return false;
    }